

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Line.cpp
# Opt level: O0

vector<bool,_std::allocator<bool>_> * __thiscall
Line::generate_option
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,Line *this,
          vector<int,_std::allocator<int>_> *position_indexes,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *possible_per_number)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference this_00;
  reference rVar6;
  reference local_80;
  int local_6c;
  int local_68;
  int j;
  int i;
  allocator<bool> local_52;
  bool local_51;
  undefined1 local_50 [8];
  vector<bool,_std::allocator<bool>_> option;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *possible_per_number_local;
  vector<int,_std::allocator<int>_> *position_indexes_local;
  Line *this_local;
  
  uVar1 = this->m_size;
  local_51 = false;
  option.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)possible_per_number;
  std::allocator<bool>::allocator(&local_52);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_50,(ulong)uVar1,&local_51,&local_52);
  std::allocator<bool>::~allocator(&local_52);
  local_68 = 0;
  while( true ) {
    uVar3 = (ulong)local_68;
    sVar4 = std::vector<int,_std::allocator<int>_>::size(&this->m_numbers);
    if (sVar4 <= uVar3) break;
    local_6c = 0;
    while( true ) {
      iVar2 = local_6c;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_numbers,(long)local_68);
      if (*pvVar5 <= iVar2) break;
      this_00 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)option.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage,(long)local_68);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](position_indexes,(long)local_68);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)*pvVar5);
      rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_50,(long)(*pvVar5 + local_6c))
      ;
      local_80 = rVar6;
      std::_Bit_reference::operator=(&local_80,true);
      local_6c = local_6c + 1;
    }
    local_68 = local_68 + 1;
  }
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,(vector<bool,_std::allocator<bool>_> *)local_50);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_50)
  ;
  return __return_storage_ptr__;
}

Assistant:

vector<bool>
Line::generate_option(const vector<int> &position_indexes, const vector<vector<int>> &possible_per_number) const {
    vector<bool> option(m_size, false);

    for (int i = 0; i < m_numbers.size(); i++) {
        for (int j = 0; j < m_numbers[i]; j++) option[possible_per_number[i][position_indexes[i]] + j] = true;
    }

#if DEBUG_TRACES
    Logger logger(TRACE);
    auto &output = logger.get();
    for (auto &&tile : option) {
        output << (tile ? '1' : '0');
    }
    output << endl;
    logger.flush();
#endif //DEBUG_TRACES

    return move(option);
}